

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP3Deserializer::ParseVariablesIndex
          (BP3Deserializer *this,BufferSTL *bufferSTL,Engine *engine)

{
  char *pcVar1;
  uint uVar2;
  unsigned_long uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  pointer puVar8;
  _State_baseV2 *__tmp;
  size_t sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Result_base *this_00;
  long lVar11;
  future<void> *async;
  size_t sVar12;
  _Alloc_hider this_01;
  void *pvVar13;
  ulong uVar14;
  void *__stat_loc;
  ulong uVar15;
  vector<char,_std::allocator<char>_> *buffer;
  BP3Deserializer *this_02;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> asyncs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> asyncPositions;
  long local_e8;
  long *local_e0;
  __state_type local_d8;
  BP3Deserializer *local_c8;
  vector<char,_std::allocator<char>_> *local_c0;
  size_t local_b8;
  void *local_b0;
  string local_a8;
  __basic_future<void> local_88;
  undefined **local_78;
  ulong local_70;
  void *local_68;
  size_t local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  _func_int **local_40 [2];
  
  sVar9 = (this->m_Minifooter).PGIndexStart;
  sVar12 = (this->m_Minifooter).VarsIndexStart;
  local_c8 = this;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8," BP3 variable index start < pg index start, in call to Open","");
  sVar9 = helper::GetDistance(sVar12,sVar9,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  this_02 = local_c8;
  buffer = &bufferSTL->m_Buffer;
  sVar9 = sVar9 + 0xc;
  pvVar13 = (void *)(((local_c8->m_Minifooter).AttributesIndexStart -
                     (local_c8->m_Minifooter).VarsIndexStart) - 0xc);
  if ((ulong)*(uint *)(&local_c8->field_0x230 + *(long *)(*(long *)local_c8 + -0x18)) == 1) {
    sVar12 = sVar9;
    if (pvVar13 != (void *)0x0) {
      do {
        std::
        _Head_base<0UL,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_false>
        ::anon_class_8_1_8991fb9c_for__M_head_impl::operator()
                  ((anon_class_8_1_8991fb9c_for__M_head_impl *)this_02,engine,buffer,sVar12);
        sVar12 = sVar12 + *(uint *)((buffer->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data._M_start + sVar12) + 4;
      } while ((void *)(sVar12 - sVar9) < pvVar13);
    }
  }
  else {
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&local_a8,
               (ulong)*(uint *)(&local_c8->field_0x230 + *(long *)(*(long *)local_c8 + -0x18)),
               (allocator_type *)&local_58);
    __stat_loc = (void *)(ulong)*(uint *)(&this_02->field_0x230 +
                                         *(long *)(*(long *)this_02 + -0x18));
    local_b8 = sVar9;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_58,(size_type)__stat_loc,(allocator_type *)&local_d8);
    this_01._M_p = local_a8._M_dataplus._M_p;
    if (pvVar13 != (void *)0x0) {
      lVar11 = *(long *)this_02;
      local_78 = &PTR__M_destroy_00872b90;
      __stat_loc = (void *)0x0;
      uVar15 = 0;
      sVar9 = local_b8;
      local_c0 = buffer;
      local_b0 = pvVar13;
      do {
        if (*(int *)(&this_02->field_0x230 + *(long *)(lVar11 + -0x18)) != 0) {
          local_e8 = 0;
          uVar14 = 0;
          local_70 = uVar15;
          do {
            local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] = sVar9;
            uVar2 = *(uint *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start + sVar9);
            if ((uVar15 & 1) != 0) {
              std::future<void>::get((future<void> *)(local_a8._M_dataplus._M_p + local_e8));
              uVar15 = local_70;
            }
            puVar8 = local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            sVar9 = sVar9 + uVar2 + 4;
            __stat_loc = (void *)(sVar9 - local_b8);
            if (__stat_loc <= local_b0) {
              local_d8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              local_d8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_68 = __stat_loc;
              local_60 = sVar9;
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
              p_Var10->_M_use_count = 1;
              p_Var10->_M_weak_count = 1;
              p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00872aa8
              ;
              p_Var10[1]._M_use_count = 0;
              p_Var10[1]._M_weak_count = 0;
              *(undefined4 *)&p_Var10[2]._vptr__Sp_counted_base = 0;
              *(undefined1 *)((long)&p_Var10[2]._vptr__Sp_counted_base + 4) = 0;
              p_Var10[2]._M_use_count = 0;
              p_Var10[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var10[3]._M_use_count = 0;
              p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00872af8;
              this_00 = (_Result_base *)operator_new(0x10);
              *(undefined8 *)this_00 = 0;
              *(undefined8 *)(this_00 + 8) = 0;
              std::__future_base::_Result_base::_Result_base(this_00);
              this_02 = local_c8;
              *(undefined ***)this_00 = local_78;
              p_Var10[4]._vptr__Sp_counted_base = (_func_int **)this_00;
              uVar3 = puVar8[uVar14];
              p_Var10[4]._M_use_count = (int)uVar3;
              p_Var10[4]._M_weak_count = (int)(uVar3 >> 0x20);
              p_Var10[5]._vptr__Sp_counted_base = (_func_int **)local_c0;
              *(Engine **)&p_Var10[5]._M_use_count = engine;
              p_Var10[6]._vptr__Sp_counted_base = (_func_int **)local_c8;
              local_40[0] = (_func_int **)0x0;
              local_e0 = (long *)operator_new(0x20);
              *local_e0 = (long)&PTR___State_00872b50;
              local_e0[1] = (long)(p_Var10 + 1);
              local_e0[2] = (long)std::__future_base::
                                  _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>
                                  ::_M_run;
              local_e0[3] = 0;
              std::thread::_M_start_thread(local_40,&local_e0,0);
              if (local_e0 != (long *)0x0) {
                (**(code **)(*local_e0 + 8))();
              }
              if (p_Var10[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
                std::terminate();
              }
              p_Var10[3]._vptr__Sp_counted_base = local_40[0];
              local_d8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)(p_Var10 + 1);
              local_d8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = p_Var10;
              std::__basic_future<void>::__basic_future(&local_88,&local_d8);
              buffer = local_c0;
              if (local_d8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_d8.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              uVar4 = local_88._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._0_4_;
              uVar5 = local_88._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_;
              uVar6 = local_88._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_4_;
              uVar7 = local_88._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_;
              local_88._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              local_88._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         (local_a8._M_dataplus._M_p + local_e8 + 8);
              pcVar1 = local_a8._M_dataplus._M_p + local_e8;
              *(undefined4 *)pcVar1 = uVar4;
              *(undefined4 *)(pcVar1 + 4) = uVar5;
              *(undefined4 *)(pcVar1 + 8) = uVar6;
              *(undefined4 *)(pcVar1 + 0xc) = uVar7;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
              }
              sVar9 = local_60;
              __stat_loc = local_68;
              if (local_88._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_88._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
                sVar9 = local_60;
                __stat_loc = local_68;
              }
            }
            uVar14 = uVar14 + 1;
            lVar11 = *(long *)this_02;
            local_e8 = local_e8 + 0x10;
          } while (uVar14 < *(uint *)(&this_02->field_0x230 + *(long *)(lVar11 + -0x18)));
        }
        uVar15 = CONCAT71((int7)(uVar15 >> 8),1);
        this_01._M_p = local_a8._M_dataplus._M_p;
      } while (__stat_loc < local_b0);
    }
    for (; this_01._M_p != (pointer)local_a8._M_string_length;
        this_01._M_p = (pointer)((long)this_01._M_p + 0x10)) {
      if (*(size_type *)this_01._M_p != 0) {
        std::__basic_future<void>::wait((__basic_future<void> *)this_01._M_p,__stat_loc);
      }
    }
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&local_a8);
  }
  return;
}

Assistant:

void BP3Deserializer::ParseVariablesIndex(const BufferSTL &bufferSTL, core::Engine &engine)
{
    auto lf_ReadElementIndex = [&](core::Engine &engine, const std::vector<char> &buffer,
                                   size_t position) {
        const ElementIndexHeader header =
            ReadElementIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);

        switch (header.DataType)
        {

#define make_case(T)                                                                               \
    case (TypeTraits<T>::type_enum): {                                                             \
        DefineVariableInEngineIO<T>(header, engine, buffer, position);                             \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(make_case)
#undef make_case

        } // end switch
    };

    const auto &buffer = bufferSTL.m_Buffer;
    size_t position =
        helper::GetDistance(m_Minifooter.VarsIndexStart, m_Minifooter.PGIndexStart,
                            " BP3 variable index start < pg index start, in call to Open");

    helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian);
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    const size_t startPosition = position;
    size_t localPosition = 0;

    /* Note: In ADIOS 1.x BP3 files, length is unreliable and is
     * probably smaller than the actual length of the variable index. Let's use
     * here the more reliable limit: the start of attribute index - start of
     * variable index (- the already parsed 12 bytes)
     */
    const size_t varIndexLength =
        m_Minifooter.AttributesIndexStart - m_Minifooter.VarsIndexStart - 12;

    if (m_Parameters.Threads == 1)
    {
        while (localPosition < varIndexLength)
        {
            lf_ReadElementIndex(engine, buffer, position);

            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;
        }
        return;
    }

    // threads for reading Variables
    std::vector<std::future<void>> asyncs(m_Parameters.Threads);
    std::vector<size_t> asyncPositions(m_Parameters.Threads);

    bool launched = false;

    while (localPosition < varIndexLength)
    {
        // extract async positions
        for (unsigned int t = 0; t < m_Parameters.Threads; ++t)
        {
            asyncPositions[t] = position;
            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;

            if (launched)
            {
                asyncs[t].get();
            }

            if (localPosition <= varIndexLength)
            {
                asyncs[t] = std::async(std::launch::async, lf_ReadElementIndex, std::ref(engine),
                                       std::ref(buffer), asyncPositions[t]);
            }
        }
        launched = true;
    }

    for (auto &async : asyncs)
    {
        if (async.valid())
        {
            async.wait();
        }
    }
}